

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetTime(Cluster *this)

{
  SegmentInfo *this_00;
  longlong lVar1;
  undefined8 *in_RDI;
  longlong t;
  longlong scale;
  SegmentInfo *pInfo;
  longlong tc;
  Cluster *in_stack_ffffffffffffffe8;
  longlong local_8;
  
  local_8 = GetTimeCode(in_stack_ffffffffffffffe8);
  if (-1 < local_8) {
    this_00 = Segment::GetInfo((Segment *)*in_RDI);
    lVar1 = SegmentInfo::GetTimeCodeScale(this_00);
    local_8 = in_RDI[5] * lVar1;
  }
  return local_8;
}

Assistant:

long long Cluster::GetTime() const {
  const long long tc = GetTimeCode();

  if (tc < 0)
    return tc;

  const SegmentInfo* const pInfo = m_pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long t = m_timecode * scale;

  return t;
}